

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

void __thiscall
spvtools::val::Function::RegisterExecutionModelLimitation
          (Function *this,ExecutionModel model,string *message)

{
  pointer pcVar1;
  _func_void *p_Var2;
  long *local_68;
  long local_60;
  long local_58 [2];
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + message->_M_string_length);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  p_Var2 = (_func_void *)operator_new(0x28);
  *(ExecutionModel *)p_Var2 = model;
  *(_func_void **)(p_Var2 + 8) = p_Var2 + 0x18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(p_Var2 + 8),local_68,local_60 + (long)local_68);
  pcStack_30 = std::
               _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp:376:7)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp:376:7)>
             ::_M_manager;
  local_48._M_unused._M_function_pointer = p_Var2;
  std::__cxx11::
  list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
  ::_M_insert<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>
            ((list<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>,std::allocator<std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>>>
              *)&this->execution_model_limitations_,(iterator)&this->execution_model_limitations_,
             (function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
              *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return;
}

Assistant:

void Function::RegisterExecutionModelLimitation(spv::ExecutionModel model,
                                                const std::string& message) {
  execution_model_limitations_.push_back(
      [model, message](spv::ExecutionModel in_model, std::string* out_message) {
        if (model != in_model) {
          if (out_message) {
            *out_message = message;
          }
          return false;
        }
        return true;
      });
}